

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_node_container(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  lys_module *plVar1;
  LY_ERR LVar2;
  long *plVar3;
  lysp_ext_instance *plVar4;
  long lVar5;
  lysp_restr *must_p;
  long lVar6;
  long lVar7;
  lysp_node *plVar8;
  lysp_ext_instance *plVar9;
  
  if (pnode[1].next != (lysp_node *)0x0) {
    *(byte *)&node->flags = (byte)node->flags | 0x80;
  }
  for (plVar8 = (lysp_node *)pnode[1].ref; plVar8 != (lysp_node *)0x0; plVar8 = plVar8->next) {
    LVar2 = lys_compile_node(ctx,plVar8,node,0,(ly_set *)0x0);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
  }
  plVar8 = pnode[1].parent;
  if (plVar8 != (lysp_node *)0x0) {
    plVar1 = node[1].module;
    if (plVar1 == (lys_module *)0x0) {
      plVar3 = (long *)calloc(1,(long)plVar8[-1].exts * 0x38 + 8);
      if (plVar3 == (long *)0x0) goto LAB_0014a00b;
      lVar5 = 0;
      lVar6 = 0;
    }
    else {
      lVar6 = *(long *)&plVar1[-1].implemented;
      plVar3 = (long *)realloc(&plVar1[-1].implemented,
                               ((long)&(plVar8[-1].exts)->name + lVar6 * 2) * 0x38 + 8);
      if (plVar3 == (long *)0x0) {
LAB_0014a00b:
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_node_container");
        return LY_EMEM;
      }
      lVar5 = *plVar3;
    }
    node[1].module = (lys_module *)(plVar3 + 1);
    if (pnode[1].parent == (lysp_node *)0x0) {
      plVar9 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar9 = pnode[1].parent[-1].exts;
    }
    lVar7 = 0;
    memset(plVar3 + lVar5 * 7 + 1,0,((long)&plVar9->name + lVar6) * 0x38);
    plVar9 = (lysp_ext_instance *)0xffffffffffffffff;
    while( true ) {
      plVar8 = pnode[1].parent;
      if (plVar8 == (lysp_node *)0x0) {
        plVar4 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar4 = plVar8[-1].exts;
      }
      plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
      if (plVar4 <= plVar9) break;
      plVar1 = node[1].module;
      lVar6 = *(long *)&plVar1[-1].implemented;
      *(long *)&plVar1[-1].implemented = lVar6 + 1;
      must_p = (lysp_restr *)((long)&plVar8->parent + lVar7);
      lVar7 = lVar7 + 0x40;
      LVar2 = lys_compile_must(ctx,must_p,(lysc_must *)(&plVar1->ctx + lVar6 * 7));
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
  }
  LVar2 = lysc_unres_must_add(ctx,node,pnode);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  LVar2 = lys_compile_node_augments(ctx,node);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  for (plVar8 = (lysp_node *)pnode[1].iffeatures; plVar8 != (lysp_node *)0x0; plVar8 = plVar8->next)
  {
    LVar2 = lys_compile_node(ctx,plVar8,node,0,(ly_set *)0x0);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
  }
  plVar9 = pnode[1].exts;
  if (plVar9 != (lysp_ext_instance *)0x0) {
    do {
      LVar2 = lys_compile_node(ctx,(lysp_node *)plVar9,node,0,(ly_set *)0x0);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      plVar9 = *(lysp_ext_instance **)&plVar9->format;
    } while (plVar9 != (lysp_ext_instance *)0x0);
    return LY_SUCCESS;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lys_compile_node_container(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_container *cont_p = (struct lysp_node_container *)pnode;
    struct lysc_node_container *cont = (struct lysc_node_container *)node;
    struct lysp_node *child_p;
    LY_ERR ret = LY_SUCCESS;

    if (cont_p->presence) {
        /* presence container */
        cont->flags |= LYS_PRESENCE;
    }

    /* more cases when the container has meaning but is kept NP for convenience:
     *   - when condition
     *   - direct child action/notification
     */

    LY_LIST_FOR(cont_p->child, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

    COMPILE_ARRAY_GOTO(ctx, cont_p->musts, cont->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    LY_LIST_FOR((struct lysp_node *)cont_p->actions, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }
    LY_LIST_FOR((struct lysp_node *)cont_p->notifs, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

done:
    return ret;
}